

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

string_view __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpBase::GetSymbolName
          (BinaryReaderObjdumpBase *this,Index symbol_index)

{
  pointer pBVar1;
  ulong uVar2;
  string_view sVar3;
  BinarySection index;
  ulong uVar4;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *this_00;
  string_view sVar5;
  
  uVar2 = (ulong)symbol_index;
  pBVar1 = this[1].section_types_.
           super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  uVar4 = (*(long *)&this[1].section_found_ - (long)pBVar1 >> 4) * -0x5555555555555555;
  if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
    sVar5._M_str = "<illegal_symbol_index>";
    sVar5._M_len = 0x16;
  }
  else {
    switch(pBVar1[uVar2 * 0xc]) {
    case Custom:
      index = pBVar1[uVar2 * 0xc + 10];
      this_00 = (unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
                (this->section_starts_ + 5);
      break;
    case Type:
      sVar3._M_str = *(char **)(pBVar1 + uVar2 * 0xc + 2);
      sVar3._M_len = *(undefined8 *)(pBVar1 + uVar2 * 0xc + 4);
      return sVar3;
    case Import:
      index = pBVar1[uVar2 * 0xc + 10];
      this_00 = (unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
                (this->section_starts_ + 0xb);
      break;
    case Function:
      index = pBVar1[uVar2 * 0xc + 10];
      this_00 = (unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
                &this->section_found_;
      break;
    case Table:
      index = pBVar1[uVar2 * 0xc + 10];
      this_00 = &this->err_stream_;
      break;
    case Memory:
      index = pBVar1[uVar2 * 0xc + 10];
      this_00 = (unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> *)
                (this[1].section_starts_ + 4);
      break;
    default:
      abort();
    }
    sVar5 = ObjdumpNames::Get((ObjdumpNames *)this_00,index);
  }
  return sVar5;
}

Assistant:

std::string_view BinaryReaderObjdumpBase::GetSymbolName(
    Index symbol_index) const {
  if (symbol_index >= objdump_state_->symtab.size())
    return "<illegal_symbol_index>";
  ObjdumpSymbol& sym = objdump_state_->symtab[symbol_index];
  switch (sym.kind) {
    case SymbolType::Function:
      return GetFunctionName(sym.index);
    case SymbolType::Data:
      return sym.name;
    case SymbolType::Global:
      return GetGlobalName(sym.index);
    case SymbolType::Section:
      return GetSectionName(sym.index);
    case SymbolType::Tag:
      return GetTagName(sym.index);
    case SymbolType::Table:
      return GetTableName(sym.index);
  }
  WABT_UNREACHABLE;
}